

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase59::run(TestCase59 *this)

{
  uint64_t uVar1;
  StringPtr name;
  StringPtr name_00;
  StringPtr name_01;
  StringPtr name_02;
  StringPtr name_03;
  StringPtr name_04;
  StringPtr name_05;
  StringPtr name_06;
  StringPtr name_07;
  StringPtr name_08;
  StructSchema schema;
  SchemaLoader loader;
  Schema local_d8;
  int local_d0;
  unsigned_short local_ca;
  Schema local_c8;
  Schema local_c0;
  Maybe<capnp::StructSchema::Field> local_b8;
  Field local_70;
  SchemaLoader local_30;
  
  SchemaLoader::SchemaLoader(&local_30);
  local_c8.raw = (RawBrandedSchema *)(schemas::s_a76e3c9bb7fd56d3 + 0x48);
  Schema::getProto((Reader *)&local_b8,&local_c8);
  local_70.parent.super_Schema = SchemaLoader::load(&local_30,(Reader *)&local_b8);
  local_d8.raw = (RawBrandedSchema *)Schema::asStruct((Schema *)&local_70);
  local_c8.raw = (RawBrandedSchema *)(schemas::s_807280a2901aa079 + 0x48);
  Schema::getProto((Reader *)&local_b8,&local_c8);
  local_70.parent.super_Schema = SchemaLoader::load(&local_30,(Reader *)&local_b8);
  Schema::asStruct((Schema *)&local_70);
  local_c8.raw = (RawBrandedSchema *)(schemas::s_c1973984dee98e3a + 0x48);
  Schema::getProto((Reader *)&local_b8,&local_c8);
  local_70.parent.super_Schema = SchemaLoader::load(&local_30,(Reader *)&local_b8);
  Schema::asStruct((Schema *)&local_70);
  name.content.size_ = 9;
  name.content.ptr = "theUnion";
  StructSchema::getFieldByName(&local_70,(StructSchema *)&local_d8,name);
  if (local_70.proto._reader.dataSize < 0xc0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint64_t *)((long)local_70.proto._reader.data + 0x10);
  }
  local_c0 = Schema::getDependency(&local_d8,uVar1,0);
  local_c8.raw = (RawBrandedSchema *)Schema::asStruct(&local_c0);
  name_00.content.size_ = 7;
  name_00.content.ptr = "grault";
  StructSchema::getFieldByName((Field *)&local_b8,(StructSchema *)&local_c8,name_00);
  if ((((uint)local_b8.ptr.field_1._40_4_ < 0x70) ||
      (*(short *)((long)&local_b8.ptr.field_1.value.proto._reader.capTable[1]._vptr_CapTableReader +
                 4) != 6)) && (kj::_::Debug::minSeverity < 3)) {
    local_d0 = 6;
    name_01.content.size_ = 9;
    name_01.content.ptr = "theUnion";
    StructSchema::getFieldByName(&local_70,(StructSchema *)&local_d8,name_01);
    if (local_70.proto._reader.dataSize < 0xc0) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(uint64_t *)((long)local_70.proto._reader.data + 0x10);
    }
    local_c0 = Schema::getDependency(&local_d8,uVar1,0);
    local_c8.raw = (RawBrandedSchema *)Schema::asStruct(&local_c0);
    name_02.content.size_ = 7;
    name_02.content.ptr = "grault";
    StructSchema::getFieldByName((Field *)&local_b8,(StructSchema *)&local_c8,name_02);
    if ((uint)local_b8.ptr.field_1._40_4_ < 0x70) {
      local_ca = 0;
    }
    else {
      local_ca = *(unsigned_short *)
                  ((long)&local_b8.ptr.field_1.value.proto._reader.capTable[1]._vptr_CapTableReader
                  + 4);
    }
    kj::_::Debug::log<char_const(&)[191],int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x45,ERROR,
               "\"failed: expected \" \"(6) == (schema.getDependency(schema.getFieldByName(\\\"theUnion\\\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\\\"grault\\\").getProto().getOrdinal().getExplicit())\", 6, schema.getDependency(schema.getFieldByName(\"theUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"grault\").getProto().getOrdinal().getExplicit()"
               ,(char (*) [191])
                "failed: expected (6) == (schema.getDependency(schema.getFieldByName(\"theUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"grault\").getProto().getOrdinal().getExplicit())"
               ,&local_d0,&local_ca);
  }
  name_03.content.size_ = 0xd;
  name_03.content.ptr = "anotherUnion";
  StructSchema::getFieldByName(&local_70,(StructSchema *)&local_d8,name_03);
  if (local_70.proto._reader.dataSize < 0xc0) {
    uVar1 = 0;
  }
  else {
    uVar1 = *(uint64_t *)((long)local_70.proto._reader.data + 0x10);
  }
  local_c0 = Schema::getDependency(&local_d8,uVar1,0);
  local_c8.raw = (RawBrandedSchema *)Schema::asStruct(&local_c0);
  name_04.content.size_ = 6;
  name_04.content.ptr = "corge";
  StructSchema::getFieldByName((Field *)&local_b8,(StructSchema *)&local_c8,name_04);
  if ((((uint)local_b8.ptr.field_1._40_4_ < 0x70) ||
      (*(short *)((long)&local_b8.ptr.field_1.value.proto._reader.capTable[1]._vptr_CapTableReader +
                 4) != 9)) && (kj::_::Debug::minSeverity < 3)) {
    local_d0 = 9;
    name_05.content.size_ = 0xd;
    name_05.content.ptr = "anotherUnion";
    StructSchema::getFieldByName(&local_70,(StructSchema *)&local_d8,name_05);
    if (local_70.proto._reader.dataSize < 0xc0) {
      uVar1 = 0;
    }
    else {
      uVar1 = *(uint64_t *)((long)local_70.proto._reader.data + 0x10);
    }
    local_c0 = Schema::getDependency(&local_d8,uVar1,0);
    local_c8.raw = (RawBrandedSchema *)Schema::asStruct(&local_c0);
    name_06.content.size_ = 6;
    name_06.content.ptr = "corge";
    StructSchema::getFieldByName((Field *)&local_b8,(StructSchema *)&local_c8,name_06);
    if ((uint)local_b8.ptr.field_1._40_4_ < 0x70) {
      local_ca = 0;
    }
    else {
      local_ca = *(unsigned_short *)
                  ((long)&local_b8.ptr.field_1.value.proto._reader.capTable[1]._vptr_CapTableReader
                  + 4);
    }
    kj::_::Debug::log<char_const(&)[194],int,unsigned_short>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x48,ERROR,
               "\"failed: expected \" \"(9) == (schema.getDependency(schema.getFieldByName(\\\"anotherUnion\\\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\\\"corge\\\").getProto().getOrdinal().getExplicit())\", 9, schema.getDependency(schema.getFieldByName(\"anotherUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"corge\").getProto().getOrdinal().getExplicit()"
               ,(char (*) [194])
                "failed: expected (9) == (schema.getDependency(schema.getFieldByName(\"anotherUnion\").getProto().getGroup().getTypeId()) .asStruct().getFieldByName(\"corge\").getProto().getOrdinal().getExplicit())"
               ,&local_d0,&local_ca);
  }
  name_07.content.size_ = 6;
  name_07.content.ptr = "corge";
  StructSchema::findFieldByName(&local_b8,(StructSchema *)&local_d8,name_07);
  if ((local_b8.ptr.isSet == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[60]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x49,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"corge\\\") == nullptr\"",
               (char (*) [60])"failed: expected schema.findFieldByName(\"corge\") == nullptr");
  }
  name_08.content.size_ = 7;
  name_08.content.ptr = "grault";
  StructSchema::findFieldByName(&local_b8,(StructSchema *)&local_d8,name_08);
  if ((local_b8.ptr.isSet == true) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[61]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader-test.c++"
               ,0x4a,ERROR,
               "\"failed: expected \" \"schema.findFieldByName(\\\"grault\\\") == nullptr\"",
               (char (*) [61])"failed: expected schema.findFieldByName(\"grault\") == nullptr");
  }
  SchemaLoader::~SchemaLoader(&local_30);
  return;
}

Assistant:

TEST(SchemaLoader, LoadLateUnion) {
  SchemaLoader loader;

  StructSchema schema =
      loader.load(Schema::from<test::TestLateUnion>().getProto()).asStruct();
  loader.load(Schema::from<test::TestLateUnion::TheUnion>().getProto()).asStruct();
  loader.load(Schema::from<test::TestLateUnion::AnotherUnion>().getProto()).asStruct();

  EXPECT_EQ(6,
      schema.getDependency(schema.getFieldByName("theUnion").getProto().getGroup().getTypeId())
            .asStruct().getFieldByName("grault").getProto().getOrdinal().getExplicit());
  EXPECT_EQ(9,
      schema.getDependency(schema.getFieldByName("anotherUnion").getProto().getGroup().getTypeId())
            .asStruct().getFieldByName("corge").getProto().getOrdinal().getExplicit());
  EXPECT_TRUE(schema.findFieldByName("corge") == nullptr);
  EXPECT_TRUE(schema.findFieldByName("grault") == nullptr);
}